

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O1

bool dis_test(vw *all,example *ec,single_learner *base,float param_4,float threshold)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  
  bVar2 = true;
  if (3.0 < (double)ec->weight + all->sd->t) {
    fVar1 = (ec->pred).scalar;
    fVar3 = (float)(**(code **)(base + 0x50))
                             (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
    fVar3 = ABS(fVar1) / fVar3;
    ec->confidence = fVar3;
    bVar2 = fVar3 / (float)all->sd->t <= threshold;
  }
  return bVar2;
}

Assistant:

bool dis_test(vw& all, example& ec, single_learner& base, float /* prediction */, float threshold)
{
  if (all.sd->t + ec.weight <= 3)
  {
    return true;
  }

  // Get loss difference
  float middle = 0.f;
  ec.confidence = fabsf(ec.pred.scalar - middle) / base.sensitivity(ec);

  float k = (float)all.sd->t;
  float loss_delta = ec.confidence / k;

  bool result = (loss_delta <= threshold);

  return result;
}